

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group.cpp
# Opt level: O3

void __thiscall
duckdb::ColumnScanState::Initialize
          (ColumnScanState *this,LogicalType *type,vector<duckdb::StorageIndex,_true> *children,
          optional_ptr<duckdb::TableScanOptions,_true> options)

{
  ulong __n;
  PhysicalType PVar1;
  size_type __n_00;
  child_list_t<LogicalType> *this_00;
  const_reference pvVar2;
  reference pvVar3;
  const_reference pvVar4;
  LogicalType *pLVar5;
  vector<bool,_true> *this_01;
  size_type __n_01;
  vector<duckdb::ColumnScanState,_true> *pvVar6;
  size_type __new_size;
  size_type __n_02;
  reference rVar7;
  
  (this->scan_options).ptr = options.ptr;
  if (type->id_ != VALIDITY) {
    PVar1 = type->physical_type_;
    if (PVar1 == LIST) {
      pvVar6 = &this->child_states;
      ::std::vector<duckdb::ColumnScanState,_std::allocator<duckdb::ColumnScanState>_>::resize
                (&pvVar6->
                  super_vector<duckdb::ColumnScanState,_std::allocator<duckdb::ColumnScanState>_>,2)
      ;
      pvVar3 = vector<duckdb::ColumnScanState,_true>::operator[](pvVar6,1);
      pLVar5 = ListType::GetChildType(type);
      Initialize(pvVar3,pLVar5,options);
      pvVar3 = vector<duckdb::ColumnScanState,_true>::operator[](pvVar6,0);
      (pvVar3->scan_options).ptr = options.ptr;
    }
    else {
      if (PVar1 == ARRAY) {
        pvVar6 = &this->child_states;
        ::std::vector<duckdb::ColumnScanState,_std::allocator<duckdb::ColumnScanState>_>::resize
                  (&pvVar6->
                    super_vector<duckdb::ColumnScanState,_std::allocator<duckdb::ColumnScanState>_>,
                   2);
        pvVar3 = vector<duckdb::ColumnScanState,_true>::operator[](pvVar6,0);
        (pvVar3->scan_options).ptr = options.ptr;
        pvVar3 = vector<duckdb::ColumnScanState,_true>::operator[](pvVar6,1);
        pLVar5 = ArrayType::GetChildType(type);
        Initialize(pvVar3,pLVar5,options);
        return;
      }
      if (PVar1 == STRUCT) {
        this_00 = StructType::GetChildTypes_abi_cxx11_(type);
        pvVar6 = &this->child_states;
        ::std::vector<duckdb::ColumnScanState,_std::allocator<duckdb::ColumnScanState>_>::resize
                  (&pvVar6->
                    super_vector<duckdb::ColumnScanState,_std::allocator<duckdb::ColumnScanState>_>,
                   ((long)(this_00->
                          super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                          ).
                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this_00->
                          super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                          ).
                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7 + 1);
        this_01 = &this->scan_child_column;
        __new_size = ((long)(this_00->
                            super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                            ).
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this_00->
                            super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                            ).
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
        if ((children->super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>).
            super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
            super__Vector_impl_data._M_start ==
            (children->super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>).
            super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          ::std::vector<bool,_std::allocator<bool>_>::resize
                    (&this_01->super_vector<bool,_std::allocator<bool>_>,__new_size,true);
          if ((this_00->
              super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              ).
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              (this_00->
              super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              ).
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            __n_02 = 0;
            do {
              __n = __n_02 + 1;
              pvVar3 = vector<duckdb::ColumnScanState,_true>::operator[](pvVar6,__n);
              pvVar4 = vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                       ::operator[](this_00,__n_02);
              Initialize(pvVar3,&pvVar4->second,options);
              __n_02 = __n;
            } while (__n < (ulong)(((long)(this_00->
                                          super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                          ).
                                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(this_00->
                                          super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                          ).
                                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                  0x6db6db6db6db6db7));
          }
        }
        else {
          ::std::vector<bool,_std::allocator<bool>_>::resize
                    (&this_01->super_vector<bool,_std::allocator<bool>_>,__new_size,false);
          if ((children->super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>).
              super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
              _M_impl.super__Vector_impl_data._M_finish !=
              (children->super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>).
              super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
              _M_impl.super__Vector_impl_data._M_start) {
            __n_01 = 0;
            do {
              pvVar2 = vector<duckdb::StorageIndex,_true>::operator[](children,__n_01);
              __n_00 = pvVar2->index;
              rVar7 = vector<bool,_true>::get<true>(this_01,__n_00);
              *rVar7._M_p = *rVar7._M_p | rVar7._M_mask;
              pvVar3 = vector<duckdb::ColumnScanState,_true>::operator[](pvVar6,__n_00 + 1);
              pvVar4 = vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                       ::operator[](this_00,__n_00);
              Initialize(pvVar3,&pvVar4->second,&pvVar2->child_indexes,options);
              __n_01 = __n_01 + 1;
            } while (__n_01 < (ulong)((long)(children->
                                            super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                            ).
                                            super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(children->
                                            super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                            ).
                                            super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 5));
          }
        }
        pvVar3 = vector<duckdb::ColumnScanState,_true>::operator[](pvVar6,0);
        (pvVar3->scan_options).ptr = options.ptr;
      }
      else {
        ::std::vector<duckdb::ColumnScanState,_std::allocator<duckdb::ColumnScanState>_>::resize
                  (&(this->child_states).
                    super_vector<duckdb::ColumnScanState,_std::allocator<duckdb::ColumnScanState>_>,
                   1);
        pvVar3 = vector<duckdb::ColumnScanState,_true>::operator[](&this->child_states,0);
        (pvVar3->scan_options).ptr = options.ptr;
      }
    }
  }
  return;
}

Assistant:

void ColumnScanState::Initialize(const LogicalType &type, const vector<StorageIndex> &children,
                                 optional_ptr<TableScanOptions> options) {
	// Register the options in the state
	scan_options = options;

	if (type.id() == LogicalTypeId::VALIDITY) {
		// validity - nothing to initialize
		return;
	}
	if (type.InternalType() == PhysicalType::STRUCT) {
		// validity + struct children
		auto &struct_children = StructType::GetChildTypes(type);
		child_states.resize(struct_children.size() + 1);

		if (children.empty()) {
			// scan all struct children
			scan_child_column.resize(struct_children.size(), true);
			for (idx_t i = 0; i < struct_children.size(); i++) {
				child_states[i + 1].Initialize(struct_children[i].second, options);
			}
		} else {
			// only scan the specified subset of columns
			scan_child_column.resize(struct_children.size(), false);
			for (idx_t i = 0; i < children.size(); i++) {
				auto &child = children[i];
				auto index = child.GetPrimaryIndex();
				auto &child_indexes = child.GetChildIndexes();
				scan_child_column[index] = true;
				child_states[index + 1].Initialize(struct_children[index].second, child_indexes, options);
			}
		}
		child_states[0].scan_options = options;
	} else if (type.InternalType() == PhysicalType::LIST) {
		// validity + list child
		child_states.resize(2);
		child_states[1].Initialize(ListType::GetChildType(type), options);
		child_states[0].scan_options = options;
	} else if (type.InternalType() == PhysicalType::ARRAY) {
		// validity + array child
		child_states.resize(2);
		child_states[0].scan_options = options;
		child_states[1].Initialize(ArrayType::GetChildType(type), options);
	} else {
		// validity
		child_states.resize(1);
		child_states[0].scan_options = options;
	}
}